

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

Expression * __thiscall slang::ast::ClassType::getBaseConstructorCall(ClassType *this)

{
  Scope *this_00;
  StatementKind SVar1;
  int iVar2;
  SyntaxNode *pSVar3;
  Type *this_01;
  Symbol *pSVar4;
  SyntaxNode *pSVar5;
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> sourceRange_00;
  Type *pTVar6;
  SubroutineSymbol *this_02;
  Statement *pSVar7;
  Expression *pEVar8;
  Diagnostic *pDVar9;
  SourceLocation SVar10;
  ulong uVar11;
  Expression *pEVar12;
  Diagnostic *this_03;
  long lVar13;
  ushort uVar14;
  DiagCode noteCode;
  SyntaxNode *argSyntax;
  long lVar15;
  SourceRange SVar16;
  _Storage<slang::SourceRange,_true> _Var17;
  undefined7 uStack_bf;
  undefined7 uStack_a7;
  ASTContext local_a0;
  TokenKind local_68;
  undefined1 uStack_66;
  NumericTokenFlags NStack_65;
  uint32_t uStack_64;
  Info *local_60;
  undefined1 local_38;
  
  if ((this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged == true) {
    return (this->baseConstructorCall).
           super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value;
  }
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
       (Expression *)0x0;
  pSVar3 = (this->super_Type).super_Symbol.originatingSyntax;
  if (*(long *)(pSVar3 + 6) == 0) {
    return (Expression *)0x0;
  }
  this_00 = &this->super_Scope;
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(this_00);
  }
  this_01 = this->baseClass;
  pTVar6 = this_01->canonical;
  if (pTVar6 == (Type *)0x0) {
    Type::resolveCanonical(this_01);
    pTVar6 = this_01->canonical;
  }
  if ((pTVar6->super_Symbol).kind == ErrorType) {
    return (Expression *)0x0;
  }
  this_02 = getConstructor(this);
  if (this_02 == (SubroutineSymbol *)0x0) {
    uVar14 = 0;
    pEVar12 = (Expression *)0x0;
  }
  else {
    uVar14 = (this_02->flags).m_bits;
    pSVar7 = SubroutineSymbol::getBody(this_02);
    SVar1 = pSVar7->kind;
    if (SVar1 == Invalid) {
      return (Expression *)0x0;
    }
    uVar14 = uVar14 >> 0xc;
    if (SVar1 == List) {
      if (pSVar7[1].syntax == (StatementSyntax *)0x0) {
LAB_0022bc36:
        pEVar12 = (Expression *)0x0;
      }
      else {
        lVar13 = 0;
        do {
          iVar2 = **(int **)(*(long *)(pSVar7 + 1) + lVar13);
          if (iVar2 != 5) {
            pEVar12 = (Expression *)0x0;
            if (iVar2 == 4) {
              pEVar8 = *(Expression **)(*(int **)(*(long *)(pSVar7 + 1) + lVar13) + 8);
              goto LAB_0022bbed;
            }
            break;
          }
          lVar13 = lVar13 + 8;
          pEVar12 = (Expression *)0x0;
        } while ((long)pSVar7[1].syntax << 3 != lVar13);
      }
    }
    else {
      pEVar12 = (Expression *)0x0;
      if (SVar1 == ExpressionStatement) {
        pEVar8 = *(Expression **)(pSVar7 + 1);
LAB_0022bbed:
        if (pEVar8->kind != NewClass) goto LAB_0022bc36;
        pEVar12 = (Expression *)0x0;
        if ((char)pEVar8[1].kind != Invalid) {
          pEVar12 = pEVar8;
        }
      }
    }
  }
  local_a0.lookupIndex = this->headerIndex;
  local_a0.flags.m_bits = 0;
  local_a0.instanceOrProc = (Symbol *)0x0;
  local_a0.firstTempVar = (TempVarSymbol *)0x0;
  local_a0.randomizeDetails = (RandomizeDetails *)0x0;
  local_a0.assertionInstance = (AssertionInstanceDetails *)0x0;
  pSVar3 = *(SyntaxNode **)(pSVar3 + 6);
  pEVar8 = *(Expression **)(pSVar3 + 2);
  local_a0.scope.ptr = this_00;
  if (pEVar12 == (Expression *)0x0) {
    if (pEVar8 == (Expression *)0x0) goto LAB_0022bd72;
    if (this->baseConstructor != (Symbol *)0x0) {
      _Var17._M_value = slang::syntax::SyntaxNode::sourceRange(pSVar3);
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_a7;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = _Var17._M_value;
      SVar10 = _Var17._M_value.endLoc;
      Lookup::ensureVisible(this->baseConstructor,&local_a0,sourceRange);
      _local_68 = (Segment *)this->baseConstructor;
      local_38 = 0;
      SVar16.endLoc = SVar10;
      SVar16.startLoc = (SourceLocation)&local_a0;
      pEVar12 = CallExpression::fromArgs
                          ((CallExpression *)(local_a0.scope.ptr)->compilation,
                           (Compilation *)&stack0xffffffffffffff98,(Subroutine *)0x0,pEVar8,
                           (ArgumentListSyntax *)_Var17._M_value.startLoc,SVar16,
                           (ASTContext *)_Var17._M_value.endLoc);
      goto LAB_0022bee0;
    }
    if (pEVar8[1].sourceRange.endLoc != (SourceLocation)0x0) {
      SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pEVar8);
      pDVar9 = ASTContext::addDiag(&local_a0,(DiagCode)0xa00007,SVar16);
      Diagnostic::operator<<(pDVar9,(this->baseClass->super_Symbol).name);
      _local_68 = (Segment *)0x0;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<long>(&pDVar9->args,(long *)&stack0xffffffffffffff98);
      uVar11 = (long)pEVar8[1].sourceRange.endLoc + 1U >> 1;
      local_68 = (short)uVar11;
      uStack_66 = (char)(uVar11 >> 0x10);
      NStack_65.raw = (char)(uVar11 >> 0x18);
      uStack_64 = (int)(uVar11 >> 0x20);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar9->args,(unsigned_long *)&stack0xffffffffffffff98);
    }
  }
  else {
    if ((pEVar8 != (Expression *)0x0) ||
       (pEVar8 = (Expression *)pSVar3[2].parent, pEVar8 != (Expression *)0x0)) {
      pDVar9 = ASTContext::addDiag(&local_a0,(DiagCode)0x70006,pEVar12->sourceRange);
      _local_68 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pEVar8);
      SVar10 = parsing::Token::location((Token *)&stack0xffffffffffffff98);
      noteCode.subsystem = General;
      noteCode.code = 0xc;
LAB_0022bcc1:
      Diagnostic::addNote(pDVar9,noteCode,SVar10);
      return (Expression *)0x0;
    }
LAB_0022bd72:
    if (pSVar3[2].parent != (SyntaxNode *)0x0) {
      if ((uVar14 & 1) == 0) {
        pDVar9 = ASTContext::addDiag(&local_a0,(DiagCode)0x640007,(this_02->super_Symbol).location);
        SVar16 = slang::syntax::SyntaxNode::sourceRange(pSVar3[2].parent);
        Diagnostic::addNote(pDVar9,(DiagCode)0xc0001,SVar16);
      }
      uVar14 = 1;
    }
  }
  pSVar4 = this->baseConstructor;
  if (pEVar12 == (Expression *)0x0 && pSVar4 != (Symbol *)0x0) {
    if ((uVar14 & 1) == 0) {
      if (*(int *)&pSVar4[1].nextInScope != 0) {
        Scope::elaborate((Scope *)(pSVar4 + 1));
      }
      lVar13 = *(long *)(pSVar4 + 4);
      if (lVar13 != 0) {
        pSVar5 = pSVar4[3].originatingSyntax;
        lVar15 = 0;
        do {
          pEVar12 = FormalArgumentSymbol::getDefaultValue
                              (*(FormalArgumentSymbol **)((long)&pSVar5->kind + lVar15));
          if (pEVar12 == (Expression *)0x0) {
            SVar16 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
            pDVar9 = ASTContext::addDiag(&local_a0,(DiagCode)0x80006,SVar16);
            this_03 = Diagnostic::operator<<(pDVar9,(this->super_Type).super_Symbol.name);
            Diagnostic::operator<<(this_03,(this->baseClass->super_Symbol).name);
            SVar10 = this->baseConstructor->location;
            noteCode.subsystem = General;
            noteCode.code = 5;
            goto LAB_0022bcc1;
          }
          lVar15 = lVar15 + 8;
        } while (lVar13 << 3 != lVar15);
      }
      pSVar4 = this->baseConstructor;
      _Var17._M_value = slang::syntax::SyntaxNode::sourceRange(pSVar3);
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_bf;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = _Var17._M_value;
      Lookup::ensureVisible(pSVar4,&local_a0,sourceRange_00);
    }
    pEVar12 = (Expression *)0x0;
  }
LAB_0022bee0:
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
       pEVar12;
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
  return pEVar12;
}

Assistant:

const Expression* ClassType::getBaseConstructorCall() const {
    if (baseConstructorCall)
        return *baseConstructorCall;

    baseConstructorCall = nullptr;
    const Expression* callExpr = nullptr;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto& classSyntax = syntax->as<ClassDeclarationSyntax>();
    if (!classSyntax.extendsClause)
        return nullptr;

    ensureElaborated();

    SLANG_ASSERT(baseClass);
    if (baseClass->isError())
        return nullptr;

    // If we have a constructor, find whether it invokes super.new in its body.
    bool constructorHasDefault = false;
    auto ourConstructor = getConstructor();
    if (ourConstructor) {
        auto checkForSuperNew = [&](const Statement& stmt) {
            if (stmt.kind == StatementKind::ExpressionStatement) {
                auto& expr = stmt.as<ExpressionStatement>().expr;
                if (expr.kind == ExpressionKind::NewClass &&
                    expr.as<NewClassExpression>().isSuperClass) {
                    callExpr = &expr;
                }
            }
        };

        // If the body is invalid, early out now so we don't report
        // spurious errors on top of it.
        constructorHasDefault = ourConstructor->flags.has(MethodFlags::DefaultedSuperArg);
        auto& body = ourConstructor->getBody();
        if (body.bad())
            return nullptr;

        if (body.kind != StatementKind::List) {
            checkForSuperNew(body);
        }
        else {
            for (auto stmt : body.as<StatementList>().list) {
                if (stmt->kind != StatementKind::VariableDeclaration) {
                    checkForSuperNew(*stmt);
                    break;
                }
            }
        }
    }

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));
    auto& extendsClause = *classSyntax.extendsClause;

    // Can't have both a super.new and extends arguments.
    if (callExpr && (extendsClause.arguments || extendsClause.defaultedArg)) {
        auto argSyntax = extendsClause.arguments ? (const SyntaxNode*)extendsClause.arguments
                                                 : extendsClause.defaultedArg;
        auto& diag = context.addDiag(diag::BaseConstructorDuplicate, callExpr->sourceRange);
        diag.addNote(diag::NotePreviousUsage, argSyntax->getFirstToken().location());
        return nullptr;
    }

    if (auto extendsArgs = extendsClause.arguments) {
        // If we have a base class constructor, create the call to it.
        if (baseConstructor) {
            SourceRange range = extendsClause.sourceRange();
            Lookup::ensureVisible(*baseConstructor, context, range);

            callExpr = &CallExpression::fromArgs(context.getCompilation(),
                                                 &baseConstructor->as<SubroutineSymbol>(), nullptr,
                                                 extendsArgs, range, context);
        }
        else if (!extendsArgs->parameters.empty()) {
            auto& diag = context.addDiag(diag::TooManyArguments, extendsArgs->sourceRange());
            diag << baseClass->name;
            diag << 0;
            diag << extendsArgs->parameters.size();
        }
    }
    else if (extendsClause.defaultedArg) {
        SLANG_ASSERT(ourConstructor);
        if (!constructorHasDefault) {
            auto& diag = context.addDiag(diag::InvalidExtendsDefault, ourConstructor->location);
            diag.addNote(diag::NotePreviousUsage, extendsClause.defaultedArg->sourceRange());
        }

        constructorHasDefault = true;
    }

    // If we have a base class constructor and nothing called it, make sure
    // it has no arguments or all of the arguments have default values.
    // If our own constructor declares a 'default' arg then this requirement
    // is removed since we will insert the appropriate call arguments automatically.
    if (baseConstructor && !callExpr && !constructorHasDefault) {
        for (auto arg : baseConstructor->as<SubroutineSymbol>().getArguments()) {
            if (!arg->getDefaultValue()) {
                auto& diag = context.addDiag(diag::BaseConstructorNotCalled,
                                             extendsClause.sourceRange());
                diag << name << baseClass->name;
                diag.addNote(diag::NoteDeclarationHere, baseConstructor->location);
                return nullptr;
            }
        }

        Lookup::ensureVisible(*baseConstructor, context, extendsClause.sourceRange());
    }

    baseConstructorCall = callExpr;
    return callExpr;
}